

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::advance_setup(PeleLM *this,Real time,Real dt,int iteration,int ncycle)

{
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  pointer pSVar1;
  MultiFab *dst;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  FabArray<amrex::FArrayBox> *this_01;
  double *pdVar3;
  mapped_type *pmVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  char *__end;
  bool bVar11;
  double dVar12;
  MFIter mfi;
  Box local_ec;
  undefined1 local_d0 [32];
  int local_b0;
  int local_a8;
  Array4<double> local_70;
  
  NavierStokesBase::advance_setup(&this->super_NavierStokesBase,time,dt,iteration,ncycle);
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (((this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start)->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  if (floor_species == 1) {
    amrex::MFIter::MFIter
              ((MFIter *)local_d0,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    if (local_b0 < local_a8) {
      do {
        amrex::MFIter::tilebox(&local_ec,(MFIter *)local_d0);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_70,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFIter *)local_d0,
                   first_spec);
        if (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]) {
          iVar5 = local_ec.smallend.vect[2];
          do {
            if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
              pdVar3 = (double *)
                       ((long)local_70.p +
                       ((long)iVar5 - (long)local_70.begin.z) * local_70.kstride * 8 +
                       ((long)local_ec.smallend.vect[1] - (long)local_70.begin.y) *
                       local_70.jstride * 8 + (long)local_ec.smallend.vect[0] * 8 +
                       (long)local_70.begin.x * -8);
              lVar8 = (long)local_ec.smallend.vect[1];
              do {
                lVar6 = (long)local_ec.smallend.vect[0];
                pdVar7 = pdVar3;
                if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
                  do {
                    lVar10 = 9;
                    pdVar9 = pdVar7;
                    do {
                      dVar12 = *pdVar9;
                      if (1.79769313486232e+308 <= dVar12) {
                        dVar12 = 1.79769313486232e+308;
                      }
                      if (dVar12 <= 0.0) {
                        dVar12 = 0.0;
                      }
                      *pdVar9 = dVar12;
                      pdVar9 = pdVar9 + local_70.nstride;
                      lVar10 = lVar10 + -1;
                    } while (lVar10 != 0);
                    lVar6 = lVar6 + 1;
                    pdVar7 = pdVar7 + 1;
                  } while (local_ec.bigend.vect[0] + 1 != (int)lVar6);
                }
                lVar8 = lVar8 + 1;
                pdVar3 = pdVar3 + local_70.jstride;
              } while (local_ec.bigend.vect[1] + 1 != (int)lVar8);
            }
            bVar11 = iVar5 != local_ec.bigend.vect[2];
            iVar5 = iVar5 + 1;
          } while (bVar11);
        }
        amrex::MFIter::operator++((MFIter *)local_d0);
      } while (local_b0 < local_a8);
    }
    amrex::MFIter::~MFIter((MFIter *)local_d0);
  }
  RhoH_to_Temp((MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0);
  if (0 < NavierStokesBase::num_state_type) {
    lVar8 = 0xd0;
    lVar6 = 0;
    do {
      pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      dst = *(MultiFab **)((long)&(pSVar1->domain).smallend + lVar8 + 0xffffffffffffffe8U);
      amrex::MultiFab::Copy
                (dst,*(MultiFab **)((long)&(pSVar1->domain).smallend + lVar8 + -0x10),0,0,
                 (dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
                 (dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0xe0;
    } while (lVar6 < NavierStokesBase::num_state_type);
  }
  if ((this->super_NavierStokesBase).super_AmrLevel.level == 0) {
    set_htt_hmixTYP(this);
  }
  NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  if (((plot_reactions == true) && ((this->super_NavierStokesBase).super_AmrLevel.level == 0)) &&
     (lVar8 = (long)*(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore)
                             .super_AmrMesh.super_AmrInfo.field_0x8c, -1 < lVar8)) {
    lVar8 = lVar8 + 1;
    do {
      _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8 + -1]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      local_d0._0_8_ = (long)local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"REACTIONS","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)((long)_Var2.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                               + 0x1908),(key_type *)local_d0);
      this_01 = &((pmVar4->_M_t).
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                 super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (this_01,0.0,0,(this_01->super_FabArrayBase).n_comp,
                 &(this_01->super_FabArrayBase).n_grow);
      if (local_d0._0_8_ != (long)local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      lVar6 = lVar8 + -1;
      bVar11 = 0 < lVar8;
      lVar8 = lVar6;
    } while (lVar6 != 0 && bVar11);
  }
  return;
}

Assistant:

void
PeleLM::advance_setup (Real time,
                       Real dt,
                       int  iteration,
                       int  ncycle)
{
   NavierStokesBase::advance_setup(time, dt, iteration, ncycle);

   // Perform operations on old data before copying into New:
   // Floor species if required.
   MultiFab& S_old = get_old_data(State_Type);
   if (floor_species == 1)
   {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx     = mfi.tilebox();
         auto const& rhoY  = S_old.array(mfi,first_spec);
         amrex::ParallelFor(bx, [rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
         });
      }
   }

   // Reset temperature
   RhoH_to_Temp(S_old);

   // Copy States Old -> New
   for (int k = 0; k < num_state_type; k++)
   {
      MultiFab& nstate = get_new_data(k);
      const MultiFab& ostate = get_old_data(k);
      MultiFab::Copy(nstate,ostate,0,0,nstate.nComp(),nstate.nGrow());
   }
   if (level == 0) {
      set_htt_hmixTYP();
   }

   // Make rho_new in NSB, rho_old already done in NSB::advance_setup
   make_rho_curr_time();

   if (plot_reactions && level == 0)
   {
      for (int i = parent->finestLevel(); i >= 0; --i)
         getLevel(i).auxDiag["REACTIONS"]->setVal(0);
   }
}